

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O0

void __thiscall
charls::jpeg_stream_reader::try_read_hp_color_transform_segment(jpeg_stream_reader *this)

{
  bool bVar1;
  byte bVar2;
  size_t sVar3;
  const_iterator __first1;
  const_iterator __last1;
  iterator __first2;
  undefined1 auStack_28 [7];
  uint8_t transformation;
  array<unsigned_char,_4UL> local_14;
  jpeg_stream_reader *pjStack_10;
  array<unsigned_char,_4UL> mrfx_tag;
  jpeg_stream_reader *this_local;
  
  pjStack_10 = this;
  sVar3 = const_byte_span::size(&this->segment_data_);
  if (sVar3 != 5) {
    __assert_fail("segment_data_.size() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_reader.cpp"
                  ,0x29e,"void charls::jpeg_stream_reader::try_read_hp_color_transform_segment()");
  }
  builtin_memcpy(local_14._M_elems,"mrfx",4);
  __first1 = std::array<unsigned_char,_4UL>::cbegin(&local_14);
  __last1 = std::array<unsigned_char,_4UL>::cend(&local_14);
  _auStack_28 = read_bytes(this,4);
  __first2 = const_byte_span::begin((const_byte_span *)auStack_28);
  bVar1 = std::equal<unsigned_char_const*,unsigned_char_const*>(__first1,__last1,__first2);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar2 = read_byte(this);
    if (3 < bVar2) {
      if (bVar2 - 4 < 2) {
        impl::throw_jpegls_error(UnsupportedColorTransform);
      }
      impl::throw_jpegls_error(InvalidCompressedData);
    }
    (this->parameters_).transformation = (uint)bVar2;
  }
  return;
}

Assistant:

void jpeg_stream_reader::try_read_hp_color_transform_segment()
{
    ASSERT(segment_data_.size() == 5);

    const array<uint8_t, 4> mrfx_tag{'m', 'r', 'f', 'x'}; // mrfx = xfrm (in big endian) = colorXFoRM
    if (!equal(mrfx_tag.cbegin(), mrfx_tag.cend(), read_bytes(4).begin()))
        return;

    const auto transformation{read_byte()};
    switch (transformation)
    {
    case static_cast<uint8_t>(color_transformation::none):
    case static_cast<uint8_t>(color_transformation::hp1):
    case static_cast<uint8_t>(color_transformation::hp2):
    case static_cast<uint8_t>(color_transformation::hp3):
        parameters_.transformation = static_cast<color_transformation>(transformation);
        return;

    case 4: // RgbAsYuvLossy (The standard lossy RGB to YCbCr transform used in JPEG.)
    case 5: // Matrix (transformation is controlled using a matrix that is also stored in the segment.
        throw_jpegls_error(jpegls_errc::color_transform_not_supported);

    default:
        throw_jpegls_error(jpegls_errc::invalid_encoded_data);
    }
}